

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O1

void __thiscall QWizardPrivate::addField(QWizardPrivate *this,QWizardField *field)

{
  char *pcVar1;
  QMapData<std::map<QString,_int,_std::less<QString>,_std::allocator<std::pair<const_QString,_int>_>_>_>
  *pQVar2;
  const_iterator cVar3;
  QObject *pQVar4;
  long in_FS_OFFSET;
  QWizardField myField;
  QObject local_d0 [8];
  QObject local_c8 [12];
  int local_bc;
  undefined1 local_b8 [128];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar1 = *(char **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  local_b8._112_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_b8._120_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_b8._96_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_b8._104_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_b8._0_8_ = field->page;
  local_b8._8_8_ = (field->name).d.d;
  local_b8._16_8_ = (field->name).d.ptr;
  local_b8._24_8_ = (field->name).d.size;
  if ((QArrayData *)local_b8._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((QArrayData *)local_b8._8_8_)->ref_)->ref_)._q_value.super___atomic_base<int>.
    _M_i = (((QArrayData *)&((QArrayData *)local_b8._8_8_)->ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_b8[0x20] = field->mandatory;
  local_b8._33_7_ = *(undefined7 *)&field->field_0x21;
  local_b8._40_8_ = field->object;
  local_b8._48_8_ = (field->property).d.d;
  local_b8._56_8_ = (field->property).d.ptr;
  local_b8._64_8_ = (field->property).d.size;
  if ((QArrayData *)local_b8._48_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((QArrayData *)local_b8._48_8_)->ref_)->ref_)._q_value.super___atomic_base<int>
    ._M_i = (((QArrayData *)&((QArrayData *)local_b8._48_8_)->ref_)->ref_)._q_value.
            super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_b8._72_8_ = (field->changedSignal).d.d;
  local_b8._80_8_ = (field->changedSignal).d.ptr;
  local_b8._88_8_ = (field->changedSignal).d.size;
  if ((QArrayData *)local_b8._72_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((QArrayData *)local_b8._72_8_)->ref_)->ref_)._q_value.super___atomic_base<int>
    ._M_i = (((QArrayData *)&((QArrayData *)local_b8._72_8_)->ref_)->ref_)._q_value.
            super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  ::QVariant::QVariant((QVariant *)(local_b8 + 0x60),&field->initialValue);
  QWizardField::resolve((QWizardField *)local_b8,&this->defaultPropertyTable);
  pQVar2 = (this->fieldIndexMap).d.d.ptr;
  if (pQVar2 != (QMapData<std::map<QString,_int,_std::less<QString>,_std::allocator<std::pair<const_QString,_int>_>_>_>
                 *)0x0) {
    cVar3 = std::
            _Rb_tree<QString,_std::pair<const_QString,_int>,_std::_Select1st<std::pair<const_QString,_int>_>,_std::less<QString>,_std::allocator<std::pair<const_QString,_int>_>_>
            ::find(&(pQVar2->m)._M_t,(key_type *)(local_b8 + 8));
    if ((_Rb_tree_header *)cVar3._M_node !=
        &(((this->fieldIndexMap).d.d.ptr)->m)._M_t._M_impl.super__Rb_tree_header) {
      addField();
      goto LAB_00513f0a;
    }
  }
  local_bc = (int)(this->fields).d.size;
  QMap<QString,_int>::insert(&this->fieldIndexMap,(key_type *)(local_b8 + 8),&local_bc);
  QtPrivate::QMovableArrayOps<QWizardField>::emplace<QWizardField_const&>
            ((QMovableArrayOps<QWizardField> *)&this->fields,(this->fields).d.size,
             (QWizardField *)local_b8);
  QList<QWizardField>::end(&this->fields);
  if ((local_b8[0x20] == true) && (local_b8._88_8_ != 0)) {
    pQVar4 = (QObject *)local_b8._80_8_;
    if ((QObject *)local_b8._80_8_ == (QObject *)0x0) {
      pQVar4 = (QObject *)&QByteArray::_empty;
    }
    QObject::connect(local_c8,(char *)local_b8._40_8_,pQVar4,(char *)local_b8._0_8_,0x6f858f);
    QMetaObject::Connection::~Connection((Connection *)local_c8);
  }
  QObject::connect(local_d0,(char *)local_b8._40_8_,(QObject *)"2destroyed(QObject*)",pcVar1,
                   0x6f85ae);
  QMetaObject::Connection::~Connection((Connection *)local_d0);
LAB_00513f0a:
  ::QVariant::~QVariant((QVariant *)(local_b8 + 0x60));
  if ((QArrayData *)local_b8._72_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_b8._72_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_b8._72_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_b8._72_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_b8._72_8_,1,0x10);
    }
  }
  if ((QArrayData *)local_b8._48_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_b8._48_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_b8._48_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_b8._48_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_b8._48_8_,1,0x10);
    }
  }
  if ((QArrayData *)local_b8._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_b8._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_b8._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_b8._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_b8._8_8_,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWizardPrivate::addField(const QWizardField &field)
{
    Q_Q(QWizard);

    QWizardField myField = field;
    myField.resolve(defaultPropertyTable);

    if (Q_UNLIKELY(fieldIndexMap.contains(myField.name))) {
        qWarning("QWizardPage::addField: Duplicate field '%ls'", qUtf16Printable(myField.name));
        return;
    }

    fieldIndexMap.insert(myField.name, fields.size());
    fields += myField;
    if (myField.mandatory && !myField.changedSignal.isEmpty())
        QObject::connect(myField.object, myField.changedSignal,
                         myField.page, SLOT(_q_maybeEmitCompleteChanged()));
    QObject::connect(
        myField.object, SIGNAL(destroyed(QObject*)), q,
        SLOT(_q_handleFieldObjectDestroyed(QObject*)));
}